

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall
kj::Function<void_(unsigned_int,_unsigned_int)>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:3147:19)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:3147:19)>
             *this,uint params,uint params_1)

{
  ArrayBuilder<CallbackEvent> *this_00;
  CallbackEvent *pCVar1;
  CallbackEvent *__dest;
  RemoveConst<CallbackEvent> *pRVar2;
  RemoveConst<CallbackEvent> RVar3;
  ulong capacity;
  size_t __n;
  ArrayBuilder<CallbackEvent> local_58;
  
  this_00 = &((this->f).callbackEvents)->builder;
  pRVar2 = this_00->pos;
  if (pRVar2 == this_00->endPtr) {
    pCVar1 = this_00->ptr;
    capacity = 4;
    if ((long)pRVar2 - (long)pCVar1 != 0) {
      capacity = (long)pRVar2 - (long)pCVar1 >> 2;
    }
    if (capacity < (ulong)((long)pRVar2 - (long)pCVar1 >> 3)) {
      this_00->pos = pCVar1 + capacity;
    }
    __dest = (CallbackEvent *)
             _::HeapArrayDisposer::allocateImpl
                       (8,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    pCVar1 = __dest + capacity;
    local_58.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
    __n = (long)this_00->pos - (long)this_00->ptr;
    local_58.ptr = __dest;
    local_58.endPtr = pCVar1;
    if (__n != 0) {
      memcpy(__dest,this_00->ptr,__n);
    }
    local_58.pos = (RemoveConst<CallbackEvent> *)((long)__dest + __n);
    ArrayBuilder<CallbackEvent>::dispose(this_00);
    this_00->ptr = __dest;
    this_00->pos = (RemoveConst<CallbackEvent> *)((long)__dest + __n);
    this_00->endPtr = pCVar1;
    this_00->disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
    local_58.ptr = (CallbackEvent *)0x0;
    local_58.pos = (RemoveConst<CallbackEvent> *)0x0;
    local_58.endPtr = (CallbackEvent *)0x0;
    ArrayBuilder<CallbackEvent>::dispose(&local_58);
    pRVar2 = this_00->pos;
  }
  RVar3.pendingCount = params_1;
  RVar3.runningCount = params;
  *pRVar2 = RVar3;
  this_00->pos = this_00->pos + 1;
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }